

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_expression_move.hpp
# Opt level: O1

bool __thiscall
optimization::global_expr_move::BlockOps::has_op
          (BlockOps *this,
          variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
          *op)

{
  bool bVar1;
  variant_alternative_t<1UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *pvVar2;
  const_iterator cVar3;
  variant_alternative_t<0UL,_variant<Op,_pair<pair<VarId,_Value>,_VarId>_>_> *__k;
  iterator iVar4;
  pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId> load;
  anon_class_8_1_a78179b7_conflict local_b8;
  undefined1 local_b0 [48];
  undefined **local_80;
  uint32_t local_78;
  variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  local_70;
  
  local_70.
  super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  .
  super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  .
  super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  .
  super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  .
  super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  .
  super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
  ._M_index = (op->
              super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              ).
              super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              .
              super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              .
              super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              .
              super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              .
              super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
              ._M_index;
  local_b0._0_8_ = &local_70;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_&>
    ::_S_vtable._M_arr
    [(long)(char)local_70.
                 super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 .
                 super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 .
                 super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 .
                 super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 .
                 super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 .
                 super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
                 ._M_index + 1]._M_data)((anon_class_8_1_a78179b7_conflict4 *)local_b0,op);
  bVar1 = disable_op(this,&local_70);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    if ((op->
        super__Variant_base<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        ).
        super__Move_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_assign_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Move_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Copy_ctor_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        .
        super__Variant_storage_alias<optimization::global_expr_move::Op,_std::pair<std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>
        ._M_index == '\0') {
      __k = std::
            get<0ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                      (op);
      iVar4 = std::
              _Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<optimization::global_expr_move::Op,_std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_std::allocator<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<optimization::global_expr_move::Op>,_optimization::global_expr_move::hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this,__k);
      bVar1 = iVar4.
              super__Node_iterator_base<std::pair<const_optimization::global_expr_move::Op,_mir::inst::VarId>,_true>
              ._M_cur == (__node_type *)0x0;
    }
    else {
      pvVar2 = std::
               get<1ul,optimization::global_expr_move::Op,std::pair<std::pair<mir::inst::VarId,mir::inst::Value>,mir::inst::VarId>>
                         (op);
      local_b8.__lhs = (_Copy_ctor_base<false,_int,_mir::inst::VarId> *)(local_b0 + 0x18);
      local_b0._0_8_ = &PTR_display_001ee058;
      local_b0._8_4_ = (pvVar2->first).first.id;
      local_b0[0x28] = (pvVar2->first).second.field_0x18;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
        ::_S_vtable._M_arr[(long)(char)(pvVar2->first).second.field_0x18 + 1]._M_data)
                (&local_b8,(variant<int,_mir::inst::VarId> *)&(pvVar2->first).second.field_0x8);
      local_b0._16_8_ = &PTR_display_001effc8;
      local_b0[0x29] = (pvVar2->first).second.shift;
      local_b0[0x2a] = (pvVar2->first).second.shift_amount;
      local_80 = &PTR_display_001ee058;
      local_78 = (pvVar2->second).id;
      cVar3 = std::
              _Rb_tree<std::pair<mir::inst::VarId,_mir::inst::Value>,_std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>,_std::_Select1st<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>,_std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>,_std::allocator<std::pair<const_std::pair<mir::inst::VarId,_mir::inst::Value>,_mir::inst::VarId>_>_>
              ::find(&(this->loads)._M_t,(key_type *)local_b0);
      bVar1 = (_Rb_tree_header *)cVar3._M_node == &(this->loads)._M_t._M_impl.super__Rb_tree_header;
    }
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool has_op(std::variant<Op, LoadOp> op) {
    // for (auto& op : ops) {
    //   auto opInst =
    //       mir::inst::OpInst(mir::inst::VarId(0), op.lhs, op.rhs, op.op);
    //   std::cout << opInst << std::endl;
    // }
    if (disable_op(op)) {
      return false;
    }
    if (op.index() == 0) {
      return ops.find(std::get<Op>(op)) != ops.end();
    } else {
      auto load = std::get<LoadOp>(op);
      return loads.count(load.first);
    }
  }